

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void handle_error_bad_pseudo(Function *fn,Pseudo *pseudo,char *msg)

{
  TextBuffer *mb;
  
  (fn->tb).pos = 0;
  mb = &fn->tb;
  raviX_buffer_add_string(mb,msg);
  raviX_buffer_add_string(mb,": ");
  raviX_output_pseudo(pseudo,mb);
  (*fn->api->error_message)(fn->api->context,(fn->tb).buf);
  longjmp((__jmp_buf_tag *)fn->env,1);
}

Assistant:

static void handle_error_bad_pseudo(Function *fn, const Pseudo *pseudo, const char *msg)
{
	// TODO source and line number
	raviX_buffer_reset(&fn->tb);
	raviX_buffer_add_string(&fn->tb, msg);
	raviX_buffer_add_string(&fn->tb, ": ");
	raviX_output_pseudo(pseudo, &fn->tb);
	fn->api->error_message(fn->api->context, fn->tb.buf);
	longjmp(fn->env, 1);
}